

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswCut.c
# Opt level: O1

int Csw_CutMergeOrdered(Csw_Man_t *p,Csw_Cut_t *pC0,Csw_Cut_t *pC1,Csw_Cut_t *pC)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint *puVar12;
  long lVar13;
  
  bVar1 = pC0->nFanins;
  uVar7 = (ulong)bVar1;
  cVar2 = pC1->nFanins;
  uVar9 = (uint)cVar2;
  if ((char)bVar1 < cVar2) {
    __assert_fail("pC0->nFanins >= pC1->nFanins",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswCut.c"
                  ,0x129,
                  "int Csw_CutMergeOrdered(Csw_Man_t *, Csw_Cut_t *, Csw_Cut_t *, Csw_Cut_t *)");
  }
  uVar8 = (uint)(char)bVar1;
  uVar4 = p->nLeafMax;
  if (uVar4 == uVar9 && uVar4 == uVar8) {
    if ('\0' < (char)bVar1) {
      uVar10 = 0;
      do {
        if (*(int *)((long)&pC0[1].pNext + uVar10 * 4) != *(int *)((long)&pC1[1].pNext + uVar10 * 4)
           ) {
          return 0;
        }
        uVar10 = uVar10 + 1;
      } while (uVar8 != uVar10);
    }
    if ('\0' < (char)bVar1) {
      uVar10 = 0;
      do {
        *(undefined4 *)((long)&pC[1].pNext + uVar10 * 4) =
             *(undefined4 *)((long)&pC0[1].pNext + uVar10 * 4);
        uVar10 = uVar10 + 1;
      } while (uVar8 != uVar10);
    }
  }
  else if (uVar4 == uVar8) {
    if ('\0' < cVar2) {
      uVar10 = 0;
      puVar12 = (uint *)(&pC0->nCutSize + (ulong)uVar8 * 2);
      uVar4 = uVar8;
LAB_004e90e7:
      do {
        uVar5 = uVar4;
        uVar11 = (int)uVar8 >> 0x1f & uVar8;
        if (0 < (int)uVar5) {
          iVar6 = *puVar12;
          puVar12 = puVar12 + -1;
          uVar4 = uVar5 - 1;
          uVar11 = uVar5;
          if (iVar6 != *(int *)((long)&pC1[1].pNext + uVar10 * 4)) goto LAB_004e90e7;
        }
        if (uVar11 == 0) {
          return 0;
        }
        uVar10 = uVar10 + 1;
        puVar12 = (uint *)(&pC0->nCutSize + (ulong)uVar8 * 2);
        uVar4 = uVar8;
      } while (uVar10 != uVar9);
    }
    if ('\0' < (char)bVar1) {
      uVar10 = 0;
      do {
        *(undefined4 *)((long)&pC[1].pNext + uVar10 * 4) =
             *(undefined4 *)((long)&pC0[1].pNext + uVar10 * 4);
        uVar10 = uVar10 + 1;
      } while (uVar8 != uVar10);
    }
  }
  else {
    if (p->nLeafMax < 1) {
      uVar4 = 0;
      uVar11 = 0;
      uVar7 = 0;
    }
    else {
      uVar7 = 0;
      uVar11 = 0;
      uVar4 = 0;
      do {
        if (uVar11 == uVar9) {
          if (uVar4 == uVar8) goto LAB_004e91bd;
          lVar13 = (long)(int)uVar4;
          uVar4 = uVar4 + 1;
          iVar6 = *(int *)((long)&pC0[1].pNext + lVar13 * 4);
LAB_004e9180:
          *(int *)((long)&pC[1].pNext + uVar7 * 4) = iVar6;
        }
        else {
          if (uVar4 == uVar8) {
            lVar13 = (long)(int)uVar11;
            uVar11 = uVar11 + 1;
            iVar6 = *(int *)((long)&pC1[1].pNext + lVar13 * 4);
            goto LAB_004e9180;
          }
          iVar6 = *(int *)((long)&pC0[1].pNext + (long)(int)uVar4 * 4);
          iVar3 = *(int *)((long)&pC1[1].pNext + (long)(int)uVar11 * 4);
          if (iVar6 < iVar3) {
            uVar4 = uVar4 + 1;
            goto LAB_004e9180;
          }
          if (iVar3 < iVar6) {
            uVar11 = uVar11 + 1;
            *(int *)((long)&pC[1].pNext + uVar7 * 4) = iVar3;
          }
          else {
            uVar4 = uVar4 + 1;
            *(int *)((long)&pC[1].pNext + uVar7 * 4) = iVar6;
            uVar11 = uVar11 + 1;
          }
        }
        uVar7 = uVar7 + 1;
      } while ((long)uVar7 < (long)p->nLeafMax);
    }
    if ((int)uVar4 < (int)uVar8) {
      return 0;
    }
    if ((int)uVar11 < (int)uVar9) {
      return 0;
    }
  }
LAB_004e91bd:
  pC->nFanins = (char)uVar7;
  return 1;
}

Assistant:

static inline int Csw_CutMergeOrdered( Csw_Man_t * p, Csw_Cut_t * pC0, Csw_Cut_t * pC1, Csw_Cut_t * pC )
{ 
    int i, k, c;
    assert( pC0->nFanins >= pC1->nFanins );
    // the case of the largest cut sizes
    if ( pC0->nFanins == p->nLeafMax && pC1->nFanins == p->nLeafMax )
    {
        for ( i = 0; i < pC0->nFanins; i++ )
            if ( pC0->pFanins[i] != pC1->pFanins[i] )
                return 0;
        for ( i = 0; i < pC0->nFanins; i++ )
            pC->pFanins[i] = pC0->pFanins[i];
        pC->nFanins = pC0->nFanins;
        return 1;
    }
    // the case when one of the cuts is the largest
    if ( pC0->nFanins == p->nLeafMax )
    {
        for ( i = 0; i < pC1->nFanins; i++ )
        {
            for ( k = pC0->nFanins - 1; k >= 0; k-- )
                if ( pC0->pFanins[k] == pC1->pFanins[i] )
                    break;
            if ( k == -1 ) // did not find
                return 0;
        }
        for ( i = 0; i < pC0->nFanins; i++ )
            pC->pFanins[i] = pC0->pFanins[i];
        pC->nFanins = pC0->nFanins;
        return 1;
    }

    // compare two cuts with different numbers
    i = k = 0;
    for ( c = 0; c < p->nLeafMax; c++ )
    {
        if ( k == pC1->nFanins )
        {
            if ( i == pC0->nFanins )
            {
                pC->nFanins = c;
                return 1;
            }
            pC->pFanins[c] = pC0->pFanins[i++];
            continue;
        }
        if ( i == pC0->nFanins )
        {
            if ( k == pC1->nFanins )
            {
                pC->nFanins = c;
                return 1;
            }
            pC->pFanins[c] = pC1->pFanins[k++];
            continue;
        }
        if ( pC0->pFanins[i] < pC1->pFanins[k] )
        {
            pC->pFanins[c] = pC0->pFanins[i++];
            continue;
        }
        if ( pC0->pFanins[i] > pC1->pFanins[k] )
        {
            pC->pFanins[c] = pC1->pFanins[k++];
            continue;
        }
        pC->pFanins[c] = pC0->pFanins[i++]; 
        k++;
    }
    if ( i < pC0->nFanins || k < pC1->nFanins )
        return 0;
    pC->nFanins = c;
    return 1;
}